

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::AbstractTransaction::GetHash
          (ByteData256 *__return_storage_ptr__,AbstractTransaction *this,bool has_witness)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  undefined1 local_38 [8];
  ByteData buffer;
  bool has_witness_local;
  AbstractTransaction *this_local;
  
  buffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = has_witness;
  (*this->_vptr_AbstractTransaction[0xd])((ByteData *)local_38,this,(ulong)(has_witness & 1));
  ByteData::GetBytes(&local_50,(ByteData *)local_38);
  HashUtil::Sha256D(__return_storage_ptr__,&local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  ByteData::~ByteData((ByteData *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 AbstractTransaction::GetHash(bool has_witness) const {
  ByteData buffer = GetByteData(has_witness);
  // sha256d hash
  return HashUtil::Sha256D(buffer.GetBytes());
}